

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.cc
# Opt level: O0

int RaptorCondVarWait(raptor_condvar_t *cv,raptor_mutex_t *mutex,int64_t timeout_ms)

{
  undefined1 local_50 [8];
  timespec abstime;
  long sec;
  timeval now;
  int error;
  int64_t timeout_ms_local;
  raptor_mutex_t *mutex_local;
  raptor_condvar_t *cv_local;
  
  now.tv_usec._4_4_ = 0;
  if (timeout_ms < 0) {
    now.tv_usec._4_4_ = pthread_cond_wait((pthread_cond_t *)cv,(pthread_mutex_t *)mutex);
  }
  else {
    gettimeofday((timeval *)&sec,(__timezone_ptr_t)0x0);
    sec = timeout_ms / 1000 + sec;
    now.tv_sec = (timeout_ms % 1000) * 1000 + now.tv_sec;
    abstime.tv_nsec = now.tv_sec / 1000000;
    if (0 < abstime.tv_nsec) {
      sec = abstime.tv_nsec + sec;
      now.tv_sec = now.tv_sec % 1000000;
    }
    local_50 = (undefined1  [8])sec;
    abstime.tv_sec = now.tv_sec * 1000;
    now.tv_usec._4_4_ =
         pthread_cond_timedwait((pthread_cond_t *)cv,(pthread_mutex_t *)mutex,(timespec *)local_50);
  }
  return (uint)(now.tv_usec._4_4_ == 0x6e);
}

Assistant:

int RaptorCondVarWait(
    raptor_condvar_t* cv, raptor_mutex_t* mutex, int64_t timeout_ms) {
    int error = 0;
    if (timeout_ms < 0) {
        error = pthread_cond_wait(cv, mutex);
    } else {
        struct timeval now;
        gettimeofday(&now, nullptr);
        now.tv_sec += static_cast<time_t>(timeout_ms / 1000);
        now.tv_usec += static_cast<long>((timeout_ms % 1000) * 1000);
        long sec = now.tv_usec / 1000000;
        if (sec > 0) {
            now.tv_sec += sec;
            now.tv_usec -= sec * 1000000;
        }
        struct timespec abstime;
        abstime.tv_sec = now.tv_sec;
        abstime.tv_nsec = now.tv_usec * 1000;
        error = pthread_cond_timedwait(cv, mutex, &abstime);
    }
    return (error == ETIMEDOUT) ? 1 : 0;
}